

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O0

MPP_RET multi_core_wait(HalJpegeCtx *ctx,HalEncTask *task)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  void *__src;
  RK_U32 partion_len;
  RK_S32 partion_fd;
  void *partion_ptr;
  void *stream_ptr;
  RK_S32 fd;
  RK_U32 *regs;
  RK_U32 i;
  RK_U32 val;
  MPP_RET ret;
  RK_U32 hw_bit;
  RK_U32 sw_bit;
  JpegeFeedback *feedback;
  JpegeMultiCoreCtx *ctx_ext;
  HalEncTask *task_local;
  HalJpegeCtx *ctx_local;
  
  pvVar1 = ctx->ctx_ext;
  ret = MPP_OK;
  val = 0;
  i = 0;
  if ((hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","poll partion_num %d\n",(char *)0x0,
               (ulong)*(uint *)((long)pvVar1 + 4));
  }
  for (regs._4_4_ = 0; regs._4_4_ < *(uint *)((long)pvVar1 + 4); regs._4_4_ = regs._4_4_ + 1) {
    lVar2 = *(long *)((long)pvVar1 + (ulong)regs._4_4_ * 8 + 0x80);
    if ((hal_jpege_debug & 4) != 0) {
      _mpp_log_l(4,"hal_jpege_vepu2","poll reg %d %p",(char *)0x0,(ulong)regs._4_4_,lVar2);
    }
    i = mpp_dev_ioctl(ctx->dev,0x10,(void *)0x0);
    if (i != MPP_OK) {
      _mpp_log_l(2,"hal_jpege_vepu2","poll cmd failed %d\n","multi_core_wait",(ulong)i);
    }
    if (regs._4_4_ == 0) {
      iVar3 = mpp_buffer_get_fd_with_caller(task->output,"multi_core_wait");
      uVar4 = *(uint *)(lVar2 + 0x1b4);
      if ((hal_jpege_debug & 0x20) != 0) {
        _mpp_log_l(4,"hal_jpege_vepu2","hw_status %08x\n",(char *)0x0,(ulong)uVar4);
      }
      (ctx->feedback).hw_status = uVar4 & 0x70;
      val = *(uint *)(lVar2 + 0xd4);
      ret = jpege_bits_get_bitpos(ctx->bits);
      (ctx->feedback).stream_length = ((uint)ret >> 3 & 0xfffffff8) + (val >> 3);
      if ((hal_jpege_debug & 4) != 0) {
        _mpp_log_l(4,"hal_jpege_vepu2","partion len = %d",(char *)0x0,(ulong)(val >> 3));
      }
      task->length = (ctx->feedback).stream_length;
      task->hw_length = task->length - ctx->hal_start_pos;
      mpp_dmabuf_sync_partial_begin(iVar3,1,0,task->length,"multi_core_wait");
    }
    else {
      pvVar5 = mpp_buffer_get_ptr_with_caller(task->output,"multi_core_wait");
      __src = mpp_buffer_get_ptr_with_caller
                        (*(MppBuffer *)((long)pvVar1 + (ulong)(regs._4_4_ - 1) * 8 + 0x18),
                         "multi_core_wait");
      iVar3 = mpp_buffer_get_fd_with_caller
                        (*(MppBuffer *)((long)pvVar1 + (ulong)(regs._4_4_ - 1) * 8 + 0x18),
                         "multi_core_wait");
      uVar4 = *(uint *)(lVar2 + 0x1b4);
      if ((hal_jpege_debug & 0x20) != 0) {
        _mpp_log_l(4,"hal_jpege_vepu2","hw_status %08x\n",(char *)0x0,(ulong)uVar4);
      }
      (ctx->feedback).hw_status = uVar4 & 0x70;
      uVar4 = *(uint *)(lVar2 + 0xd4) >> 3;
      if ((hal_jpege_debug & 4) != 0) {
        _mpp_log_l(4,"hal_jpege_vepu2","partion_len = %d",(char *)0x0,(ulong)uVar4);
      }
      mpp_dmabuf_sync_partial_begin(iVar3,1,0,uVar4,"multi_core_wait");
      memcpy((void *)((long)pvVar5 + (ulong)(ctx->feedback).stream_length),__src,(ulong)uVar4);
      (ctx->feedback).stream_length = uVar4 + (ctx->feedback).stream_length;
      task->length = (ctx->feedback).stream_length;
      task->hw_length = uVar4 + task->hw_length;
    }
  }
  if ((hal_jpege_debug & 0x20) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu2","stream bit: sw %d hw %d total %d hw_length %d\n",(char *)0x0,
               (ulong)(uint)ret,(ulong)val,(ctx->feedback).stream_length,task->hw_length);
  }
  return i;
}

Assistant:

static MPP_RET multi_core_wait(HalJpegeCtx *ctx, HalEncTask *task)
{
    JpegeMultiCoreCtx *ctx_ext = (JpegeMultiCoreCtx *)ctx->ctx_ext;
    JpegeFeedback *feedback = &ctx->feedback;
    RK_U32 sw_bit = 0;
    RK_U32 hw_bit = 0;
    MPP_RET ret = MPP_OK;
    RK_U32 val;
    RK_U32 i;

    hal_jpege_dbg_detail("poll partion_num %d\n", ctx_ext->partion_num);

    for (i = 0; i < ctx_ext->partion_num; i++) {
        RK_U32 *regs = ctx_ext->regs_out[i];

        hal_jpege_dbg_detail("poll reg %d %p", i, regs);

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret)
            mpp_err_f("poll cmd failed %d\n", ret);

        if (i == 0) {
            RK_S32 fd = mpp_buffer_get_fd(task->output);

            val = regs[109];
            hal_jpege_dbg_output("hw_status %08x\n", val);
            feedback->hw_status = val & 0x70;
            val = regs[53];
            sw_bit = jpege_bits_get_bitpos(ctx->bits);
            hw_bit = val;
            feedback->stream_length = ((sw_bit / 8) & (~0x7)) + hw_bit / 8;
            hal_jpege_dbg_detail("partion len = %d", hw_bit / 8);
            task->length = feedback->stream_length;
            task->hw_length = task->length - ctx->hal_start_pos;

            mpp_dmabuf_sync_partial_begin(fd, 1, 0, task->length, __FUNCTION__);
        } else {
            void *stream_ptr = mpp_buffer_get_ptr(task->output);
            void *partion_ptr = mpp_buffer_get_ptr(ctx_ext->partions_buf[i - 1]);
            RK_S32 partion_fd = mpp_buffer_get_fd(ctx_ext->partions_buf[i - 1]);
            RK_U32 partion_len = 0;

            val = regs[109];
            hal_jpege_dbg_output("hw_status %08x\n", val);
            feedback->hw_status = val & 0x70;
            partion_len = regs[53] / 8;
            hal_jpege_dbg_detail("partion_len = %d", partion_len);

            mpp_dmabuf_sync_partial_begin(partion_fd, 1, 0, partion_len, __FUNCTION__);

            memcpy(stream_ptr + feedback->stream_length, partion_ptr, partion_len);
            feedback->stream_length += partion_len;
            task->length = feedback->stream_length;
            task->hw_length += partion_len;
        }
    }

    hal_jpege_dbg_output("stream bit: sw %d hw %d total %d hw_length %d\n",
                         sw_bit, hw_bit, feedback->stream_length, task->hw_length);

    return ret;
}